

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingNegativeCase::generateShaders
          (ImageBindingNegativeCase *this)

{
  ShaderType SVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  const_reference pvVar5;
  ProgramSources *pPVar6;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  GLint local_c98;
  bool local_c91;
  string local_c58;
  string local_c38;
  string local_c18;
  ShaderSource local_bf8;
  string local_bd0;
  string local_bb0;
  string local_b90;
  ShaderSource local_b70;
  string local_b48;
  string local_b28;
  string local_b08;
  ShaderSource local_ae8;
  string local_ac0;
  string local_aa0;
  string local_a80;
  ShaderSource local_a60;
  ProgramSources local_a38;
  undefined1 local_968 [8];
  ProgramSources sources;
  string local_878;
  int local_854;
  undefined1 local_850 [4];
  int bindNdx;
  string local_830;
  string local_810;
  string local_7f0;
  int local_7cc;
  GLint local_7c8;
  int declNdx;
  int numDeclarations;
  bool arrayInstance;
  string imageType;
  string local_798 [8];
  string texCoordType;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  undefined1 local_300 [8];
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  ImageBindingNegativeCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragmentUniformDecl.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessEvalUniformDecl.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(texCoordType.field_2._M_local_buf + 8));
  DVar2 = getImageTexCoordType(this);
  pcVar3 = glu::getDataTypeName(DVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_798,pcVar3,(allocator<char> *)(imageType.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(imageType.field_2._M_local_buf + 0xf));
  DVar2 = glu::getDataTypeFromGLType
                    (*(deUint32 *)&(this->super_LayoutBindingNegativeCase).field_0x134);
  pcVar3 = glu::getDataTypeName(DVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numDeclarations,pcVar3,(allocator<char> *)((long)&declNdx + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&declNdx + 3));
  local_c91 = true;
  if ((this->super_LayoutBindingNegativeCase).m_testType != TESTTYPE_BINDING_ARRAY) {
    local_c91 = (this->super_LayoutBindingNegativeCase).m_testType == TESTTYPE_BINDING_MAX_ARRAY;
  }
  declNdx._2_1_ = local_c91;
  if (local_c91 == false) {
    local_c98 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  }
  else {
    local_c98 = 1;
  }
  local_7c8 = local_c98;
  for (local_7cc = 0; local_7cc < local_7c8; local_7cc = local_7cc + 1) {
    poVar4 = std::operator<<((ostream *)&fragmentUniformDecl.field_0x170,"layout(rgba8, binding = ")
    ;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_vertexShaderBinding,
                        (long)local_7cc);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
    poVar4 = std::operator<<(poVar4,") uniform readonly highp ");
    poVar4 = std::operator<<(poVar4,(string *)&numDeclarations);
    poVar4 = std::operator<<(poVar4," ");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName(&local_7f0,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_7cc);
    }
    else {
      getUniformName(&local_7f0,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_7cc,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar4 = std::operator<<(poVar4,(string *)&local_7f0);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)&local_7f0);
    poVar4 = std::operator<<((ostream *)local_300,"layout(rgba8, binding = ");
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding,
                        (long)local_7cc);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
    poVar4 = std::operator<<(poVar4,") uniform readonly highp ");
    poVar4 = std::operator<<(poVar4,(string *)&numDeclarations);
    poVar4 = std::operator<<(poVar4," ");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName(&local_810,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_7cc);
    }
    else {
      getUniformName(&local_810,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_7cc,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar4 = std::operator<<(poVar4,(string *)&local_810);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)&local_810);
    poVar4 = std::operator<<((ostream *)&tessEvalUniformDecl.field_0x170,"layout(rgba8, binding = ")
    ;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding,
                        (long)local_7cc);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
    poVar4 = std::operator<<(poVar4,") uniform readonly highp ");
    poVar4 = std::operator<<(poVar4,(string *)&numDeclarations);
    poVar4 = std::operator<<(poVar4," ");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName(&local_830,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_7cc);
    }
    else {
      getUniformName(&local_830,&(this->super_LayoutBindingNegativeCase).m_uniformName,local_7cc,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar4 = std::operator<<(poVar4,(string *)&local_830);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)&local_830);
    poVar4 = std::operator<<((ostream *)&shaderBody.field_0x170,"layout(rgba8, binding = ");
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingNegativeCase).m_tessEvalShaderBinding,
                        (long)local_7cc);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar5);
    poVar4 = std::operator<<(poVar4,") uniform readonly highp ");
    poVar4 = std::operator<<(poVar4,(string *)&numDeclarations);
    poVar4 = std::operator<<(poVar4," ");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName((string *)local_850,&(this->super_LayoutBindingNegativeCase).m_uniformName,
                     local_7cc);
    }
    else {
      getUniformName((string *)local_850,&(this->super_LayoutBindingNegativeCase).m_uniformName,
                     local_7cc,(this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    poVar4 = std::operator<<(poVar4,(string *)local_850);
    std::operator<<(poVar4,";\n");
    std::__cxx11::string::~string((string *)local_850);
  }
  for (local_854 = 0; local_854 < (this->super_LayoutBindingNegativeCase).m_numBindings;
      local_854 = local_854 + 1) {
    poVar4 = std::operator<<((ostream *)((long)&texCoordType.field_2 + 8),"\t");
    pcVar3 = "else if";
    if (local_854 == 0) {
      pcVar3 = "if";
    }
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," (u_arrayNdx == ");
    de::toString<int>(&local_878,&local_854);
    poVar4 = std::operator<<(poVar4,(string *)&local_878);
    poVar4 = std::operator<<(poVar4,")\n");
    poVar4 = std::operator<<(poVar4,"\t{\n");
    poVar4 = std::operator<<(poVar4,"\t\tcolor = imageLoad(");
    if ((declNdx._2_1_ & 1) == 0) {
      getUniformName((string *)&sources.separable,
                     &(this->super_LayoutBindingNegativeCase).m_uniformName,local_854);
    }
    else {
      getUniformName((string *)&sources.separable,
                     &(this->super_LayoutBindingNegativeCase).m_uniformName,0,local_854);
    }
    poVar4 = std::operator<<(poVar4,(string *)&sources.separable);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,local_798);
    poVar4 = std::operator<<(poVar4,"(0));\n");
    std::operator<<(poVar4,"\t}\n");
    std::__cxx11::string::~string((string *)&sources.separable);
    std::__cxx11::string::~string((string *)&local_878);
  }
  poVar4 = std::operator<<((ostream *)((long)&texCoordType.field_2 + 8),"\telse\n");
  poVar4 = std::operator<<(poVar4,"\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar4,"\t}\n");
  glu::ProgramSources::ProgramSources(&local_a38);
  SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateVertexShader(&local_a80,SVar1,&local_aa0,&local_ac0);
  glu::VertexSource::VertexSource((VertexSource *)&local_a60,&local_a80);
  pPVar6 = glu::ProgramSources::operator<<(&local_a38,&local_a60);
  SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateFragmentShader(&local_b08,SVar1,&local_b28,&local_b48);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_ae8,&local_b08);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_ae8);
  glu::ProgramSources::ProgramSources((ProgramSources *)local_968,pPVar6);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::~string((string *)&local_b28);
  glu::VertexSource::~VertexSource((VertexSource *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string((string *)&local_aa0);
  glu::ProgramSources::~ProgramSources(&local_a38);
  if (((this->super_LayoutBindingNegativeCase).m_tessSupport & 1U) != 0) {
    SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    generateTessControlShader(&local_b90,SVar1,&local_bb0,&local_bd0);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_b70,&local_b90);
    pPVar6 = glu::ProgramSources::operator<<((ProgramSources *)local_968,&local_b70);
    SVar1 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    generateTessEvaluationShader(&local_c18,SVar1,&local_c38,&local_c58);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_bf8,&local_c18);
    glu::ProgramSources::operator<<(pPVar6,&local_bf8);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_bf8);
    std::__cxx11::string::~string((string *)&local_c18);
    std::__cxx11::string::~string((string *)&local_c58);
    std::__cxx11::string::~string((string *)&local_c38);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_b70);
    std::__cxx11::string::~string((string *)&local_b90);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::__cxx11::string::~string((string *)&local_bb0);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext
                        ((this->super_LayoutBindingNegativeCase).super_TestCase.m_context);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_968);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_968);
  std::__cxx11::string::~string((string *)&numDeclarations);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(texCoordType.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalUniformDecl.field_0x170);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragmentUniformDecl.field_0x170);
  return this_00;
}

Assistant:

glu::ShaderProgram* ImageBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;

	const std::string		texCoordType	= glu::getDataTypeName(getImageTexCoordType());
	const std::string		imageType		= glu::getDataTypeName(glu::getDataTypeFromGLType(m_imageType));
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(rgba8, binding = " << m_vertexShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		fragmentUniformDecl << "layout(rgba8, binding = " << m_fragmentShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		tessCtrlUniformDecl << "layout(rgba8, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		tessEvalUniformDecl << "layout(rgba8, binding = " << m_tessEvalShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings; ++bindNdx)
	{
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = imageLoad(" << (arrayInstance ? getUniformName(m_uniformName, 0, bindNdx) : getUniformName(m_uniformName, bindNdx)) << ", " << texCoordType << "(0));\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}